

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O1

deBool qpXmlWriter_endElement(qpXmlWriter *writer,char *elementName)

{
  writer->xmlElementDepth = writer->xmlElementDepth + -1;
  if (writer->xmlPrevIsStartElement == 0) {
    fprintf((FILE *)writer->outputFile,"</%s>\n",elementName);
  }
  else {
    fwrite(" />\n",4,1,(FILE *)writer->outputFile);
    writer->xmlPrevIsStartElement = 0;
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_endElement (qpXmlWriter* writer, const char* elementName)
{
	DE_ASSERT(writer && writer->xmlElementDepth > 0);
	writer->xmlElementDepth--;

	if (writer->xmlPrevIsStartElement) /* leave flag as-is */
	{
		fprintf(writer->outputFile, " />\n");
		writer->xmlPrevIsStartElement = DE_FALSE;
	}
	else
		fprintf(writer->outputFile, "</%s>\n", /*getIndentStr(writer->xmlElementDepth),*/ elementName);

	return DE_TRUE;
}